

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

void __thiscall
cppcms::session_interface::set_session_cookie
          (session_interface *this,int64_t age,string *data,string *key)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cached_session *pcVar7;
  cached_session *pcVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  cached_settings *pcVar13;
  cached_settings *path_00;
  cached_settings *domain_00;
  cached_settings *comment;
  cached_settings *pcVar14;
  cached_settings *pcVar15;
  time_t tVar16;
  _data *p_Var17;
  string *in_RCX;
  long in_RSI;
  string *in_RDI;
  cookie the_cookie;
  bool use_samesite_strict;
  bool use_samesite_lax;
  bool use_samesite_none;
  bool httponly;
  bool secure;
  bool use_exp;
  bool use_age;
  int time_shift;
  string *path;
  string *domain;
  string cookie_name;
  session_interface *in_stack_fffffffffffffda8;
  cookie *in_stack_fffffffffffffdb0;
  cookie *in_stack_fffffffffffffe30;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  undefined1 local_130 [152];
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  string local_40 [32];
  string *local_20;
  long local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  uVar12 = std::__cxx11::string::empty();
  if ((uVar12 & 1) != 0) {
    local_10 = -1;
  }
  pcVar13 = cached_settings(in_stack_fffffffffffffda8);
  std::__cxx11::string::string(local_40,(string *)&(pcVar13->session).cookies);
  uVar12 = std::__cxx11::string::empty();
  if ((uVar12 & 1) == 0) {
    std::__cxx11::string::operator+=(local_40,"_");
    std::__cxx11::string::operator+=(local_40,local_20);
  }
  pcVar13 = cached_settings(in_stack_fffffffffffffda8);
  pcVar7 = &pcVar13->session;
  path_00 = cached_settings(in_stack_fffffffffffffda8);
  pcVar8 = &path_00->session;
  domain_00 = cached_settings(in_stack_fffffffffffffda8);
  iVar6 = (domain_00->session).cookies.time_shift;
  comment = cached_settings(in_stack_fffffffffffffda8);
  bVar10 = (comment->session).cookies.use_age & 1;
  pcVar14 = cached_settings(in_stack_fffffffffffffda8);
  bVar11 = (pcVar14->session).cookies.use_exp & 1;
  pcVar14 = cached_settings(in_stack_fffffffffffffda8);
  bVar1 = (pcVar14->session).cookies.secure;
  pcVar14 = cached_settings(in_stack_fffffffffffffda8);
  bVar2 = (pcVar14->session).cookies.httponly;
  pcVar14 = cached_settings(in_stack_fffffffffffffda8);
  bVar3 = (pcVar14->session).cookies.use_samesite_none;
  pcVar15 = cached_settings(in_stack_fffffffffffffda8);
  bVar4 = (pcVar15->session).cookies.use_samesite_lax;
  pcVar15 = cached_settings(in_stack_fffffffffffffda8);
  bVar5 = (pcVar15->session).cookies.use_samesite_strict;
  std::__cxx11::string::string(local_150,local_40);
  util::urlencode((string *)pcVar14);
  std::__cxx11::string::string(local_190,(string *)&(pcVar8->cookies).path);
  std::__cxx11::string::string(local_1b0,(string *)&(pcVar7->cookies).domain);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe30);
  http::cookie::cookie
            (in_stack_fffffffffffffe30,in_RDI,(string *)pcVar13,(string *)path_00,
             (string *)domain_00,(string *)comment);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_150);
  if (local_10 < 0) {
    if (bVar10 != 0) {
      http::cookie::max_age((cookie *)local_130,0);
    }
    if (bVar11 != 0) {
      http::cookie::expires((cookie *)local_130,1);
    }
  }
  else if (local_10 == 0) {
    http::cookie::browser_age((cookie *)local_130);
  }
  else {
    if (bVar10 != 0) {
      http::cookie::max_age((cookie *)local_130,(uint)local_10);
    }
    lVar9 = local_10;
    if (bVar11 != 0) {
      tVar16 = time((time_t *)0x0);
      http::cookie::expires((cookie *)local_130,lVar9 + tVar16 + (long)iVar6);
    }
  }
  http::cookie::secure((cookie *)local_130,(bool)(bVar1 & 1));
  http::cookie::httponly((cookie *)local_130,(bool)(bVar2 & 1));
  http::cookie::samesite_none((cookie *)local_130,(bool)(bVar3 & 1));
  http::cookie::samesite_lax((cookie *)local_130,(bool)(bVar4 & 1));
  http::cookie::samesite_strict((cookie *)local_130,(bool)(bVar5 & 1));
  p_Var17 = booster::hold_ptr<cppcms::session_interface::_data>::operator->
                      ((hold_ptr<cppcms::session_interface::_data> *)((long)&in_RDI[5].field_2 + 8))
  ;
  if (p_Var17->adapter == (session_interface_cookie_adapter *)0x0) {
    in_stack_fffffffffffffdb0 = (cookie *)http::context::response((context *)0x441b99);
    http::response::set_cookie
              ((response *)in_stack_ffffffffffffff70,(cookie *)in_stack_ffffffffffffff68);
  }
  else {
    p_Var17 = booster::hold_ptr<cppcms::session_interface::_data>::operator->
                        ((hold_ptr<cppcms::session_interface::_data> *)
                         ((long)&in_RDI[5].field_2 + 8));
    (*p_Var17->adapter->_vptr_session_interface_cookie_adapter[2])(p_Var17->adapter,local_130);
  }
  http::cookie::~cookie(in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void session_interface::set_session_cookie(int64_t age,std::string const &data,std::string const &key)
{
	if(data.empty())
		age=-1;
	std::string cookie_name=cached_settings().session.cookies.prefix;
	if(!key.empty()) {
		cookie_name+="_";
		cookie_name+=key;
	}
	std::string const &domain = cached_settings().session.cookies.domain;
	std::string const &path   = cached_settings().session.cookies.path;
	int time_shift = cached_settings().session.cookies.time_shift;
	bool use_age = cached_settings().session.cookies.use_age;
	bool use_exp = cached_settings().session.cookies.use_exp;

	bool secure = cached_settings().session.cookies.secure;
	bool httponly = cached_settings().session.cookies.httponly;
	bool use_samesite_none = cached_settings().session.cookies.use_samesite_none;
	bool use_samesite_lax = cached_settings().session.cookies.use_samesite_lax;
	bool use_samesite_strict = cached_settings().session.cookies.use_samesite_strict;

	http::cookie the_cookie(cookie_name,util::urlencode(data),path,domain);

	if(age < 0) {
		if(use_age)
			the_cookie.max_age(0);
		if(use_exp)
			the_cookie.expires(1);
	}
	else if(age == 0) {
		the_cookie.browser_age();
	}
	else {
		if(use_age)
			the_cookie.max_age(age);
		if(use_exp) {
			the_cookie.expires(age + time(0) + time_shift);
		}
	}

	the_cookie.secure(secure);
	the_cookie.httponly(httponly);
	the_cookie.samesite_none(use_samesite_none);
	the_cookie.samesite_lax(use_samesite_lax);
	the_cookie.samesite_strict(use_samesite_strict);
	
	if(d->adapter)
		d->adapter->set_cookie(the_cookie);
	else
		context_->response().set_cookie(the_cookie);
}